

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_map_suite.cpp
# Opt level: O0

void api_suite::api_size(void)

{
  pair<int,_int> (*in_RDX) [4];
  undefined4 local_5c;
  size_type local_58 [2];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 local_28 [8];
  constant_map<int,_int,_4UL,_std::less<int>_> map;
  
  local_48 = 0x200000016;
  local_40 = 0x40000002c;
  local_38 = 0x300000021;
  local_30 = 0x10000000b;
  vista::make_constant_map<int,int,4ul,std::less<int>>
            ((constant_map<int,_int,_4UL,_std::less<int>_> *)local_28,(vista *)&local_48,in_RDX);
  local_58[0] = std::array<vista::pair<int,_int>,_4UL>::size
                          ((array<vista::pair<int,_int>,_4UL> *)local_28);
  local_5c = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("map.size()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/constant_map_suite.cpp"
             ,0x58,"void api_suite::api_size()",local_58,&local_5c);
  return;
}

Assistant:

void api_size()
{
    auto map = make_constant_map<int, int>(
        {
            { 22, 2 },
            { 44, 4 },
            { 33, 3 },
            { 11, 1 }
        });
    BOOST_TEST_EQ(map.size(), 4);
}